

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall
ON_BinaryArchive::WriteArray(ON_BinaryArchive *this,ON_SimpleArray<ON_MappingChannel> *a)

{
  int iVar1;
  bool bVar2;
  ON__INT32 i;
  long lVar3;
  long lVar4;
  
  iVar1 = a->m_count;
  lVar3 = 0;
  i = 0;
  if (0 < iVar1) {
    i = iVar1;
  }
  bVar2 = WriteInt(this,i);
  lVar4 = 0;
  while ((lVar4 < iVar1 && (bVar2 != false))) {
    bVar2 = ON_MappingChannel::Write
                      ((ON_MappingChannel *)((a->m_a->m_mapping_id).Data4 + lVar3 + -8),this);
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0x98;
  }
  return bVar2;
}

Assistant:

bool ON_BinaryArchive::WriteArray( const ON_SimpleArray<ON_MappingChannel>& a)
{
  int i, count = a.Count();
  if ( count < 0 )
    count = 0;
  bool rc = WriteInt( count );
  for  ( i = 0; i < count && rc; i++ )
  {
    // ON_MappingChannel::Write() puts the element in a chunk
    rc = a[i].Write(*this);
  }
  return rc;
}